

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

bool __thiscall ON_Texture::SwapTextureCoordinate(ON_Texture *this,int i,int j)

{
  long lVar1;
  double *pdVar2;
  ON_Xform *pOVar3;
  ON_Xform *pOVar4;
  bool bVar5;
  byte bVar6;
  ON_Xform x;
  ON_Xform OStack_118;
  ON_Xform local_98;
  
  bVar6 = 0;
  bVar5 = (uint)(j | i) < 4;
  if (bVar5 && i != j) {
    pdVar2 = (double *)&ON_Xform::IdentityTransformation;
    pOVar3 = &OStack_118;
    for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
      *(double *)pOVar3 = *pdVar2;
      pdVar2 = pdVar2 + 1;
      pOVar3 = (ON_Xform *)((long)pOVar3 + 8);
    }
    OStack_118.m_xform[(uint)j][(uint)j] = 0.0;
    OStack_118.m_xform[(uint)i][(uint)i] = 0.0;
    OStack_118.m_xform[(uint)j][(uint)i] = 1.0;
    OStack_118.m_xform[(uint)i][(uint)j] = 1.0;
    ON_Xform::operator*(&local_98,&OStack_118,&this->m_uvw);
    pOVar3 = &local_98;
    pOVar4 = &this->m_uvw;
    for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
      pOVar4->m_xform[0][0] = pOVar3->m_xform[0][0];
      pOVar3 = (ON_Xform *)((long)pOVar3 + ((ulong)bVar6 * -2 + 1) * 8);
      pOVar4 = (ON_Xform *)((long)pOVar4 + (ulong)bVar6 * -0x10 + 8);
    }
  }
  return bVar5 && i != j;
}

Assistant:

bool ON_Texture::SwapTextureCoordinate( int i, int j )
{
  bool rc = false;
  if (i!=j && 0 <= i && i <= 3 && 0 <= j && j <= 3)
  {
    ON_Xform x(ON_Xform::IdentityTransformation);
    x.m_xform[i][i] = x.m_xform[j][j] = 0.0;
    x.m_xform[i][j] = x.m_xform[j][i] = 1.0;
    m_uvw = x*m_uvw;
    rc = true;
  }
  return rc;
}